

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Event.hpp
# Opt level: O0

size_t __thiscall
mahi::util::detail::
ProtoEvent<void_(int,_int,_int,_int),_mahi::util::detail::CollectorDefault<void>_>::add_cb
          (ProtoEvent<void_(int,_int,_int,_int),_mahi::util::detail::CollectorDefault<void>_> *this,
          CbFunction *cb)

{
  __shared_ptr<std::function<void_(int,_int,_int,_int)>,_(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar1;
  CbFunction *local_18;
  CbFunction *cb_local;
  ProtoEvent<void_(int,_int,_int,_int),_mahi::util::detail::CollectorDefault<void>_> *this_local;
  
  local_18 = cb;
  cb_local = (CbFunction *)this;
  std::make_shared<std::function<void(int,int,int,int)>,std::function<void(int,int,int,int)>const&>
            ((function<void_(int,_int,_int,_int)> *)&stack0xffffffffffffffd8);
  std::__cxx11::
  list<std::shared_ptr<std::function<void(int,int,int,int)>>,std::allocator<std::shared_ptr<std::function<void(int,int,int,int)>>>>
  ::emplace_back<std::shared_ptr<std::function<void(int,int,int,int)>>>
            ((list<std::shared_ptr<std::function<void(int,int,int,int)>>,std::allocator<std::shared_ptr<std::function<void(int,int,int,int)>>>>
              *)this,(shared_ptr<std::function<void_(int,_int,_int,_int)>_> *)
                     &stack0xffffffffffffffd8);
  std::shared_ptr<std::function<void_(int,_int,_int,_int)>_>::~shared_ptr
            ((shared_ptr<std::function<void_(int,_int,_int,_int)>_> *)&stack0xffffffffffffffd8);
  this_00 = &std::__cxx11::
             list<std::shared_ptr<std::function<void_(int,_int,_int,_int)>_>,_std::allocator<std::shared_ptr<std::function<void_(int,_int,_int,_int)>_>_>_>
             ::back(&this->callback_list_)->
             super___shared_ptr<std::function<void_(int,_int,_int,_int)>,_(__gnu_cxx::_Lock_policy)2>
  ;
  peVar1 = std::__shared_ptr<std::function<void_(int,_int,_int,_int)>,_(__gnu_cxx::_Lock_policy)2>::
           get(this_00);
  return (size_t)peVar1;
}

Assistant:

size_t add_cb(const CbFunction &cb)
    {
        callback_list_.emplace_back(std::make_shared<CbFunction>(cb));
        return size_t(callback_list_.back().get());
    }